

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<Point,Point>
          (string *__return_storage_ptr__,internal *this,Point *value,Point *param_2)

{
  Point *param_1_local;
  Point *value_local;
  
  PrintToString<Point>(__return_storage_ptr__,(Point *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}